

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_allocator.h
# Opt level: O0

pointer __thiscall
cppcms::impl::basic_allocator<$7099d3de$>::allocate
          (basic_allocator<_7099d3de_> *this,size_type cnt,const_pointer param_3)

{
  shmem_allocator<_ae3002f_> *this_00;
  pointer this_01;
  undefined8 uVar1;
  long in_RSI;
  basic_allocator<_7099d3de_> *in_RDI;
  void *memory;
  
  this_00 = self(in_RDI);
  this_01 = (pointer)shmem_allocator<$ae3002f$>::malloc(this_00,in_RSI << 5);
  if (this_01 == (pointer)0x0) {
    uVar1 = __cxa_allocate_exception(8);
    std::bad_alloc::bad_alloc((bad_alloc *)this_01);
    __cxa_throw(uVar1,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  return this_01;
}

Assistant:

pointer allocate(size_type cnt, std::allocator<void>::const_pointer = 0) const
	{
		void *memory=self().malloc(cnt*sizeof(T));
		if(!memory) {
			throw std::bad_alloc();
		}
		return (pointer)memory;
	}